

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O2

void __thiscall utf8_valid_3_bytes_Test::TestBody(utf8_valid_3_bytes_Test *this)

{
  int cu0;
  int cu0_00;
  int cu1;
  uint cu1_00;
  int cu2;
  uint cu2_00;
  
  cu0_00 = 0xe1;
  do {
    if (cu0_00 != 0xed) {
      if (cu0_00 == 0xf0) {
        return;
      }
      for (cu1_00 = 0; cu1_00 != 0x100; cu1_00 = cu1_00 + 1) {
        for (cu2_00 = 0; cu2_00 != 0x100; cu2_00 = cu2_00 + 1) {
          anon_unknown.dwarf_acae0::assert_is_valid_utf8
                    ((cu2_00 & 0xc0) == 0x80 && (cu1_00 & 0xc0) == 0x80,3,cu0_00,cu1_00,cu2_00,0);
        }
      }
    }
    cu0_00 = cu0_00 + 1;
  } while( true );
}

Assistant:

TEST(utf8, valid_3_bytes) {
  FOR_RANGE(cu0, 0xe1, 0xf0) {
    // Handle 0xed in valid_3_bytes_ed.
    if (cu0 == 0xed) {
      continue;
    }

    FOR_EACH_BYTE(cu1) {
      FOR_EACH_BYTE(cu2) {
        bool is_valid =
            is_in_range(cu1, 0x80, 0xc0) && is_in_range(cu2, 0x80, 0xc0);
        assert_is_valid_utf8(is_valid, 3, cu0, cu1, cu2);
      }
    }
  }
}